

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

XmlWriter * __thiscall Catch::XmlWriter::writeText(XmlWriter *this,string *text,bool indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ostream *os;
  pointer pcVar3;
  XmlEncode local_50;
  
  if (text->_M_string_length != 0) {
    bVar2 = this->m_tagIsOpen;
    ensureTagClosed(this);
    if ((indent & bVar2) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this->m_os,(this->m_indent)._M_dataplus._M_p,
                 (this->m_indent)._M_string_length);
    }
    os = this->m_os;
    paVar1 = &local_50.m_str.field_2;
    pcVar3 = (text->_M_dataplus)._M_p;
    local_50.m_str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + text->_M_string_length);
    local_50.m_forWhat = ForTextNodes;
    XmlEncode::encodeTo(&local_50,os);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.m_str._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.m_str._M_dataplus._M_p);
    }
    this->m_needsNewline = true;
  }
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeText( std::string const& text, bool indent ) {
        if( !text.empty() ){
            bool tagWasOpen = m_tagIsOpen;
            ensureTagClosed();
            if( tagWasOpen && indent )
                m_os << m_indent;
            m_os << XmlEncode( text );
            m_needsNewline = true;
        }
        return *this;
    }